

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O0

void Qentem::Memory::Sort<false,unsigned_int,unsigned_int>(uint *arr,uint start,uint end)

{
  uint local_28;
  uint local_24;
  uint offset;
  uint index;
  uint *item;
  uint end_local;
  uint start_local;
  uint *arr_local;
  
  if (start != end) {
    local_24 = start;
    for (local_28 = start + 1; local_28 < end; local_28 = local_28 + 1) {
      if (arr[start] < arr[local_28]) {
        local_24 = local_24 + 1;
        Swap<unsigned_int>(arr + local_24,arr + local_28);
      }
    }
    if (local_24 != start) {
      Swap<unsigned_int>(arr + local_24,arr + start);
    }
    Sort<false,unsigned_int,unsigned_int>(arr,start,local_24);
    Sort<false,unsigned_int,unsigned_int>(arr,local_24 + 1,end);
  }
  return;
}

Assistant:

inline static void Sort(Type_T *arr, Number_T start, Number_T end) noexcept {
    if (start != end) {
        Type_T  &item   = arr[start];
        Number_T index  = start;
        Number_T offset = (start + Number_T{1});

        while (offset < end) {
            if (Ascend_T) {
                if (arr[offset] < item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            } else {
                if (arr[offset] > item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            }

            ++offset;
        }

        if (index != start) {
            Swap(arr[index], arr[start]);
        }

        Sort<Ascend_T>(arr, start, index);
        ++index;
        Sort<Ascend_T>(arr, index, end);
    }
}